

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O3

int Dch_NodeIsConst(void *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  ulong uVar4;
  
  if (1 < (int)*(uint *)((long)p + 4)) {
    uVar1 = pObj->Id;
    if ((-1 < (long)(int)uVar1) && (uVar1 < *(uint *)((long)p + 4))) {
      plVar2 = *(long **)((long)p + 8);
      uVar3 = (uint)((ulong)(plVar2[1] - *plVar2) >> 2);
      if ((pObj->field_0x18 & 8) == 0) {
        if ((int)uVar3 < 1) {
          return 1;
        }
        uVar4 = 0;
        while (*(int *)(plVar2[(int)uVar1] + uVar4 * 4) == 0) {
          uVar4 = uVar4 + 1;
          if ((uVar3 & 0x7fffffff) == uVar4) {
            return 1;
          }
        }
      }
      else {
        if ((int)uVar3 < 1) {
          return 1;
        }
        uVar4 = 0;
        while (*(int *)(plVar2[(int)uVar1] + uVar4 * 4) == -1) {
          uVar4 = uVar4 + 1;
          if ((uVar3 & 0x7fffffff) == uVar4) {
            return 1;
          }
        }
      }
      return 0;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Dch_NodeIsConst( void * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim  = Dch_ObjSim( vSims, pObj );
    if ( pObj->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( ~pSim[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim[k] )
                return 0;
    }
    return 1;
}